

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O2

ssize_t __thiscall TextFile::write(TextFile *this,int __fd,void *__buf,size_t __n)

{
  undefined1 in_AL;
  undefined7 in_register_00000001;
  undefined7 extraout_var;
  char *pcVar1;
  undefined4 in_register_00000034;
  
  pcVar1 = (char *)CONCAT44(in_register_00000034,__fd);
  if (this->mode == Write) {
    for (; *pcVar1 != '\0'; pcVar1 = pcVar1 + 1) {
      bufPut(this,*pcVar1);
      in_register_00000001 = extraout_var;
    }
    in_AL = 0;
  }
  return CONCAT71(in_register_00000001,in_AL);
}

Assistant:

void TextFile::write(const char* line)
{
	if (mode != Write) return;

	while (*line != 0)
	{
#ifdef _WIN32
		if (*line == '\n')
			bufPut('\r');
#endif
		bufPut(*line);
		line++;
	}
}